

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void P_StartConversation(AActor *npc,AActor *pc,bool facetalker,bool saveangle)

{
  player_t *player;
  PClassInventory *itemtype;
  int iVar1;
  uint uVar2;
  AActor *pAVar3;
  FStrifeDialogueItemCheck *pFVar4;
  AActor *pAVar5;
  FStrifeDialogueNode **ppFVar6;
  DConversationMenu *this;
  size_t len;
  bool bVar7;
  float factor;
  DConversationMenu *cmenu;
  int local_58;
  byte local_51;
  int root;
  bool jump;
  undefined1 local_48 [16];
  FStrifeDialogueNode *local_38;
  FStrifeDialogueNode *CurNode;
  AActor *pAStack_28;
  int i;
  AActor *oldtarget;
  bool saveangle_local;
  APlayerPawn *pAStack_18;
  bool facetalker_local;
  AActor *pc_local;
  AActor *npc_local;
  
  if (pc->player != (player_t *)0x0) {
    oldtarget._6_1_ = saveangle;
    oldtarget._7_1_ = facetalker;
    pAStack_18 = (APlayerPawn *)pc;
    pc_local = npc;
    for (CurNode._4_4_ = 0; pAVar5 = pc_local, CurNode._4_4_ < 8; CurNode._4_4_ = CurNode._4_4_ + 1)
    {
      if ((((playeringame[CurNode._4_4_] & 1U) != 0) &&
          ((pAStack_18->super_AActor).player != (player_t *)(&players + (long)CurNode._4_4_ * 0x54))
          ) && (pAVar3 = TObjPtr::operator_cast_to_AActor_
                                   ((TObjPtr *)((long)CurNode._4_4_ * 0x2a0 + 0x1ae7340)),
               pAVar5 == pAVar3)) {
        return;
      }
    }
    TVector3<double>::Zero(&(pAStack_18->super_AActor).Vel);
    TVector2<double>::Zero(&((pAStack_18->super_AActor).player)->Vel);
    APlayerPawn::PlayIdle(pAStack_18);
    TObjPtr<AActor>::operator=
              (&((pAStack_18->super_AActor).player)->ConversationPC,&pAStack_18->super_AActor);
    TObjPtr<AActor>::operator=(&((pAStack_18->super_AActor).player)->ConversationNPC,pc_local);
    TFlags<ActorFlag5,_unsigned_int>::operator|=(&pc_local->flags5,MF5_INCONVERSATION);
    local_38 = pc_local->Conversation;
    if ((pAStack_18->super_AActor).player == (player_t *)(&players + (long)consoleplayer * 0x54)) {
      FSoundID::FSoundID((FSoundID *)(local_48 + 0xc),&gameinfo.chatSound);
      S_Sound(0x22,(FSoundID *)(local_48 + 0xc),1.0,0.0);
    }
    pc_local->reactiontime = 2;
    ((pAStack_18->super_AActor).player)->ConversationFaceTalker = (bool)(oldtarget._7_1_ & 1);
    if ((oldtarget._6_1_ & 1) != 0) {
      TAngle<double>::operator=
                (&((pAStack_18->super_AActor).player)->ConversationNPCAngle,&(pc_local->Angles).Yaw)
      ;
    }
    pAStack_28 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pc_local->target);
    TObjPtr<AActor>::operator=(&pc_local->target,&pAStack_18->super_AActor);
    if ((oldtarget._7_1_ & 1) != 0) {
      A_FaceTarget(pc_local);
      AActor::AngleTo((AActor *)local_48,&pAStack_18->super_AActor,SUB81(pc_local,0));
      TAngle<double>::operator=(&(pAStack_18->super_AActor).Angles.Yaw,(TAngle<double> *)local_48);
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)&stack0xffffffffffffffb4,
               (int)pc_local +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xffffffffffffffb4);
    bVar7 = true;
    if (uVar2 == 0) {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                ((TFlags<ActorFlag4,_unsigned_int> *)&root,
                 (int)pc_local +
                 (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&root);
      bVar7 = uVar2 != 0;
    }
    if (bVar7) {
      TObjPtr<AActor>::operator=(&pc_local->target,pAStack_28);
    }
    while( true ) {
      uVar2 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Size(&local_38->ItemCheck)
      ;
      bVar7 = false;
      if (uVar2 != 0) {
        pFVar4 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                           (&local_38->ItemCheck,0);
        bVar7 = pFVar4->Item != (PClassInventory *)0x0;
      }
      if (!bVar7) break;
      local_51 = 1;
      for (CurNode._4_4_ = 0; iVar1 = CurNode._4_4_,
          uVar2 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Size
                            (&local_38->ItemCheck), iVar1 < (int)uVar2;
          CurNode._4_4_ = CurNode._4_4_ + 1) {
        player = (pAStack_18->super_AActor).player;
        pFVar4 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                           (&local_38->ItemCheck,(long)CurNode._4_4_);
        itemtype = pFVar4->Item;
        pFVar4 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                           (&local_38->ItemCheck,(long)CurNode._4_4_);
        bVar7 = CheckStrifeItem(player,&itemtype->super_PClassActor,pFVar4->Amount);
        if (!bVar7) {
          local_51 = 0;
          break;
        }
      }
      if (((local_51 & 1) == 0) || (local_38->ItemCheckNode < 1)) break;
      pAVar5 = TObjPtr<AActor>::operator->(&((pAStack_18->super_AActor).player)->ConversationNPC);
      local_58 = pAVar5->ConversationRoot;
      ppFVar6 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                          (&StrifeDialogues,(long)(local_58 + local_38->ItemCheckNode + -1));
      local_38 = *ppFVar6;
    }
    if ((pAStack_18->super_AActor).player == (player_t *)(&players + (long)consoleplayer * 0x54)) {
      len = 0;
      bVar7 = FSoundID::operator!=(&local_38->SpeakerVoice,0);
      if (bVar7) {
        factor = FFloatCVar::operator_cast_to_float(&dlg_musicvolume);
        I_SetMusicVolume(factor);
        pAVar5 = pc_local;
        FSoundID::FSoundID((FSoundID *)((long)&cmenu + 4),&local_38->SpeakerVoice);
        len = 0x42;
        S_Sound(pAVar5,0x42,(FSoundID *)((long)&cmenu + 4),1.0,1.0);
      }
      this = (DConversationMenu *)DObject::operator_new((DObject *)0x80,len);
      DConversationMenu::DConversationMenu(this,local_38,(pAStack_18->super_AActor).player);
      if (local_38 != PrevNode) {
        DConversationMenu::mSelection = 0;
        PrevNode = local_38;
      }
      M_StartControlPanel(false);
      M_ActivateMenu((DMenu *)this);
      ConversationPauseTic = gametic + 0x14;
      menuactive = MENU_OnNoPause;
    }
  }
  return;
}

Assistant:

void P_StartConversation (AActor *npc, AActor *pc, bool facetalker, bool saveangle)
{
	AActor *oldtarget;
	int i;

	// Make sure this is actually a player.
	if (pc->player == NULL) return;

	// [CW] If an NPC is talking to a PC already, then don't let
	// anyone else talk to the NPC.
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i] || pc->player == &players[i])
			continue;

		if (npc == players[i].ConversationNPC)
			return;
	}

	pc->Vel.Zero();
	pc->player->Vel.Zero();
	static_cast<APlayerPawn*>(pc)->PlayIdle ();

	pc->player->ConversationPC = pc;
	pc->player->ConversationNPC = npc;
	npc->flags5 |= MF5_INCONVERSATION;

	FStrifeDialogueNode *CurNode = npc->Conversation;

	if (pc->player == &players[consoleplayer])
	{
		S_Sound (CHAN_VOICE | CHAN_UI, gameinfo.chatSound, 1, ATTN_NONE);
	}

	npc->reactiontime = 2;
	pc->player->ConversationFaceTalker = facetalker;
	if (saveangle)
	{
		pc->player->ConversationNPCAngle = npc->Angles.Yaw;
	}
	oldtarget = npc->target;
	npc->target = pc;
	if (facetalker)
	{
		A_FaceTarget (npc);
		pc->Angles.Yaw = pc->AngleTo(npc);
	}
	if ((npc->flags & MF_FRIENDLY) || (npc->flags4 & MF4_NOHATEPLAYERS))
	{
		npc->target = oldtarget;
	}

	// Check if we should jump to another node
	while (CurNode->ItemCheck.Size() > 0 && CurNode->ItemCheck[0].Item != NULL)
	{
		bool jump = true;
		for (i = 0; i < (int)CurNode->ItemCheck.Size(); ++i)
		{
			if(!CheckStrifeItem (pc->player, CurNode->ItemCheck[i].Item, CurNode->ItemCheck[i].Amount))
			{
				jump = false;
				break;
			}
		}
		if (jump && CurNode->ItemCheckNode > 0)
		{
			int root = pc->player->ConversationNPC->ConversationRoot;
			CurNode = StrifeDialogues[root + CurNode->ItemCheckNode - 1];
		}
		else
		{
			break;
		}
	}

	// The rest is only done when the conversation is actually displayed.
	if (pc->player == &players[consoleplayer])
	{
		if (CurNode->SpeakerVoice != 0)
		{
			I_SetMusicVolume (dlg_musicvolume);
			S_Sound (npc, CHAN_VOICE|CHAN_NOPAUSE, CurNode->SpeakerVoice, 1, ATTN_NORM);
		}

		DConversationMenu *cmenu = new DConversationMenu(CurNode, pc->player);


		if (CurNode != PrevNode)
		{ // Only reset the selection if showing a different menu.
			DConversationMenu::mSelection = 0;
			PrevNode = CurNode;
		}

		// And open the menu
		M_StartControlPanel (false);
		M_ActivateMenu(cmenu);
		ConversationPauseTic = gametic + 20;
		menuactive = MENU_OnNoPause;
	}
}